

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbj.cpp
# Opt level: O0

int main(int param_1,char **param_2)

{
  double dVar1;
  int i_2;
  double a_1;
  int i_1;
  double frequency_width;
  double center_frequency;
  BandStop bs;
  double a;
  int i;
  double b;
  double qfactor;
  double cutoff_frequency;
  double samplingrate;
  LowPass f;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  RBJbase *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  int iVar2;
  LowPass *in_stack_ffffffffffffff10;
  double in_stack_ffffffffffffff50;
  double in_stack_ffffffffffffff58;
  BandStop *in_stack_ffffffffffffff60;
  int local_84;
  double local_80;
  
  Iir::RBJ::LowPass::LowPass((LowPass *)0x10134e);
  Iir::RBJ::LowPass::setup
            (in_stack_ffffffffffffff10,
             (double)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
             (double)in_stack_ffffffffffffff00,
             (double)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  for (local_84 = 0; local_84 < 10000; local_84 = local_84 + 1) {
    local_80 = Iir::RBJ::RBJbase::filter<double>
                         (in_stack_ffffffffffffff00,
                          (double)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    std::isnan(local_80);
    assert_print((int)((ulong)in_stack_ffffffffffffff00 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  }
  fprintf(_stderr,"%e\n",local_80);
  assert_print((int)((ulong)in_stack_ffffffffffffff00 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  Iir::RBJ::BandStop::BandStop((BandStop *)0x10148e);
  Iir::RBJ::BandStop::setupN
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  for (iVar2 = 0; iVar2 < 100000; iVar2 = iVar2 + 1) {
    in_stack_ffffffffffffff00 = (RBJbase *)0x0;
    if (iVar2 == 10) {
      in_stack_ffffffffffffff00 = (RBJbase *)0x3ff0000000000000;
    }
    local_80 = Iir::RBJ::RBJbase::filter<double>
                         (in_stack_ffffffffffffff00,
                          (double)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    std::isnan(local_80);
    assert_print((int)((ulong)in_stack_ffffffffffffff00 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  }
  fprintf(_stderr,"%e\n",local_80);
  assert_print((int)((ulong)in_stack_ffffffffffffff00 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  for (iVar2 = 0; iVar2 < 100000; iVar2 = iVar2 + 1) {
    sin((double)iVar2 * 0.3141592653589793);
    dVar1 = Iir::RBJ::RBJbase::filter<double>
                      (in_stack_ffffffffffffff00,(double)CONCAT44(iVar2,in_stack_fffffffffffffef8));
    local_80 = ABS(dVar1);
    if (50000 < iVar2) {
      assert_print((int)((ulong)in_stack_ffffffffffffff00 >> 0x20),
                   (char *)CONCAT44(iVar2,in_stack_fffffffffffffef8));
    }
  }
  fprintf(_stderr,"%e\n",local_80);
  return 0;
}

Assistant:

int main(int, char**)
{
	Iir::RBJ::LowPass f;
	const double samplingrate = 1000; // Hz
	const double cutoff_frequency = 5; // Hz
	const double qfactor = 1;
	f.setup(samplingrate, cutoff_frequency, qfactor);
	double b;
	for (int i = 0; i < 10000; i++)
	{
		double a = 0;
		if (i == 10) a = 1;
		b = f.filter(a);
		//fprintf(stdout,"%e\n",b);
		assert_print(!isnan(b), "Lowpass output is NAN\n");
	}
	fprintf(stderr, "%e\n", b);
	assert_print(fabs(b) < 1E-15, "Lowpass value for t->inf to high!");

	Iir::RBJ::BandStop bs;
	const double center_frequency = 0.05;
	const double frequency_width = 0.005;
	bs.setupN(center_frequency, frequency_width);
	for (int i = 0; i < 100000; i++)
	{
		double a = 0;
		if (i == 10) a = 1;
		b = bs.filter(a);
		assert_print(!isnan(b), "Bandstop output is NAN\n");
	}
	fprintf(stderr, "%e\n", b);
	assert_print(fabs(b) < 1E-15, "Bandstop value for t->inf to high!");

	for (int i = 0; i < 100000; i++)
	{
		b = fabs(bs.filter(sin(2 * M_PI*center_frequency*i)));
		if (i > 50000) {
			assert_print(b < 1E-5, "Bandstop not removing sine.");
		}
	}
	fprintf(stderr, "%e\n", b);
	return 0;
}